

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O1

RuleInfo * __thiscall
anon_unknown.dwarf_197ca2::BuildEngineImpl::addRule
          (BuildEngineImpl *this,KeyID keyID,
          unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> *rule)

{
  unordered_map<llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo,_std::hash<llbuild::core::KeyID>,_std::equal_to<llbuild::core::KeyID>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>_>
  *this_00;
  __node_base *p_Var1;
  size_type *psVar2;
  Rule *pRVar3;
  __buckets_ptr pp_Var4;
  _Hash_node_base *p_Var5;
  BuildEngineDelegate *pBVar6;
  BuildDB *pBVar7;
  __node_ptr p_Var8;
  __node_ptr p_Var9;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var10;
  long *plVar11;
  size_type *psVar12;
  __node_ptr __bkt;
  size_type __n;
  ulong uVar13;
  __node_ptr __n_00;
  _Hash_node_base _Var14;
  __node_ptr p_Var15;
  __node_ptr this_01;
  ulong uVar16;
  __node_ptr p_Var17;
  undefined1 auVar18 [16];
  __buckets_alloc_type __alloc;
  string local_90;
  __node_ptr local_70;
  Child local_68 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  Twine local_48;
  
  this_00 = &this->ruleInfos;
  pRVar3 = (rule->_M_t).
           super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>.
           _M_t.
           super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>.
           super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl;
  (rule->_M_t).super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
  ._M_t.super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>.
  super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl = (Rule *)0x0;
  p_Var8 = (__node_ptr)operator_new(0xa8);
  (p_Var8->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  (p_Var8->
  super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
  ._M_storage._M_storage.__align = (anon_struct_8_0_00000001_for___align)keyID._value;
  *(ValueTy *)
   ((long)&(p_Var8->
           super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
           ._M_storage._M_storage + 8) = keyID._value;
  *(Rule **)((long)&(p_Var8->
                    super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
                    ._M_storage._M_storage + 0x10) = pRVar3;
  *(undefined8 *)
   ((long)&(p_Var8->
           super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
           ._M_storage._M_storage + 0x18) = 0;
  *(undefined8 *)
   ((long)&(p_Var8->
           super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
           ._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)
   ((long)&(p_Var8->
           super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
           ._M_storage._M_storage + 0x28) = 0;
  *(undefined8 *)
   ((long)&(p_Var8->
           super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
           ._M_storage._M_storage + 0x30) = 0;
  *(undefined8 *)
   ((long)&(p_Var8->
           super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
           ._M_storage._M_storage + 0x38) = 0;
  *(undefined8 *)
   ((long)&(p_Var8->
           super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
           ._M_storage._M_storage + 0x40) = 0;
  *(undefined8 *)
   ((long)&(p_Var8->
           super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
           ._M_storage._M_storage + 0x48) = 0;
  *(undefined8 *)
   ((long)&(p_Var8->
           super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
           ._M_storage._M_storage + 0x50) = 0;
  *(undefined8 *)
   ((long)&(p_Var8->
           super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
           ._M_storage._M_storage + 0x58) = 0;
  *(undefined8 *)
   ((long)&(p_Var8->
           super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
           ._M_storage._M_storage + 0x60) = 0;
  *(undefined8 *)
   ((long)&(p_Var8->
           super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
           ._M_storage._M_storage + 0x68) = 0;
  *(undefined8 *)
   ((long)&(p_Var8->
           super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
           ._M_storage._M_storage + 0x70) = 0;
  *(undefined8 *)
   ((long)&(p_Var8->
           super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
           ._M_storage._M_storage + 0x78) = 0;
  *(undefined8 *)
   ((long)&(p_Var8->
           super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
           ._M_storage._M_storage + 0x80) = 0;
  *(undefined8 *)
   ((long)&(p_Var8->
           super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
           ._M_storage._M_storage + 0x85) = 0;
  *(undefined8 *)
   ((long)&(p_Var8->
           super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
           ._M_storage._M_storage + 0x8d) = 0;
  p_Var15 = (__node_ptr)(this->ruleInfos)._M_h._M_bucket_count;
  __bkt = (__node_ptr)(keyID._value % (ulong)p_Var15);
  __n_00 = __bkt;
  p_Var9 = std::
           _Hashtable<llbuild::core::KeyID,_std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>,_std::__detail::_Select1st,_std::equal_to<llbuild::core::KeyID>,_std::hash<llbuild::core::KeyID>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,(size_type)__bkt,
                          (key_type *)
                          &p_Var8->
                           super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                          ,keyID._value);
  this_01 = p_Var8;
  p_Var17 = p_Var9;
  if (p_Var9 == (__node_ptr)0x0) {
    local_70 = p_Var9;
    auVar18 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(this->ruleInfos)._M_h._M_rehash_policy,(ulong)p_Var15,
                         (this->ruleInfos)._M_h._M_element_count);
    __n = auVar18._8_8_;
    if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (__n == 1) {
        __s = &(this->ruleInfos)._M_h._M_single_bucket;
        (this->ruleInfos)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        ((new_allocator<std::__detail::_Hash_node_base_*> *)&local_90,__n,
                         (void *)0x0);
        memset(__s,0,__n * 8);
      }
      p_Var15 = (__node_ptr)(this->ruleInfos)._M_h._M_before_begin._M_nxt;
      (this->ruleInfos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (p_Var15 != (__node_ptr)0x0) {
        p_Var1 = &(this->ruleInfos)._M_h._M_before_begin;
        _Var14._M_nxt = (_Hash_node_base *)p_Var15;
        uVar16 = 0;
        do {
          p_Var15 = (__node_ptr)(_Var14._M_nxt)->_M_nxt;
          uVar13 = (ulong)_Var14._M_nxt[0x14]._M_nxt % __n;
          if (__s[uVar13] == (_Hash_node_base *)0x0) {
            (_Var14._M_nxt)->_M_nxt = p_Var1->_M_nxt;
            p_Var1->_M_nxt = _Var14._M_nxt;
            __s[uVar13] = p_Var1;
            if ((_Var14._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              pp_Var10 = __s + uVar16;
              goto LAB_0014488c;
            }
          }
          else {
            (_Var14._M_nxt)->_M_nxt = __s[uVar13]->_M_nxt;
            pp_Var10 = &__s[uVar13]->_M_nxt;
            uVar13 = uVar16;
LAB_0014488c:
            *pp_Var10 = _Var14._M_nxt;
          }
          _Var14._M_nxt = (_Hash_node_base *)p_Var15;
          uVar16 = uVar13;
        } while (p_Var15 != (__node_ptr)0x0);
      }
      pp_Var4 = (this->ruleInfos)._M_h._M_buckets;
      if (&(this->ruleInfos)._M_h._M_single_bucket != pp_Var4) {
        p_Var15 = (__node_ptr)((this->ruleInfos)._M_h._M_bucket_count << 3);
        operator_delete(pp_Var4,(ulong)p_Var15);
      }
      (this->ruleInfos)._M_h._M_bucket_count = __n;
      (this->ruleInfos)._M_h._M_buckets = __s;
      __bkt = (__node_ptr)(keyID._value % __n);
    }
    (p_Var8->
    super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
    ).super__Hash_node_code_cache<true>._M_hash_code = keyID._value;
    pp_Var4 = (this_00->_M_h)._M_buckets;
    if (pp_Var4[(long)__bkt] == (__node_base_ptr)0x0) {
      p_Var15 = (__node_ptr)&(this->ruleInfos)._M_h._M_before_begin;
      p_Var5 = (this->ruleInfos)._M_h._M_before_begin._M_nxt;
      (p_Var8->super__Hash_node_base)._M_nxt = p_Var5;
      (this->ruleInfos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)p_Var8;
      if (p_Var5 != (_Hash_node_base *)0x0) {
        pp_Var4[(ulong)p_Var5[0x14]._M_nxt % (this->ruleInfos)._M_h._M_bucket_count] =
             (__node_base_ptr)p_Var8;
      }
      (this_00->_M_h)._M_buckets[(long)__bkt] = (__node_base_ptr)p_Var15;
    }
    else {
      (p_Var8->super__Hash_node_base)._M_nxt = pp_Var4[(long)__bkt]->_M_nxt;
      pp_Var4[(long)__bkt]->_M_nxt = (_Hash_node_base *)p_Var8;
    }
    psVar2 = &(this->ruleInfos)._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
    p_Var9 = local_70;
    __n_00 = p_Var15;
    this_01 = (__node_ptr)0x0;
    p_Var17 = p_Var8;
  }
  if (this_01 != (__node_ptr)0x0) {
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>_>_>
    ::_M_deallocate_node
              ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>_>_>
                *)this_01,__n_00);
  }
  if (p_Var9 == (__node_ptr)0x0) {
    pBVar7 = (this->db)._M_t.
             super___uniq_ptr_impl<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>
             ._M_t.
             super__Tuple_impl<0UL,_llbuild::core::BuildDB_*,_std::default_delete<llbuild::core::BuildDB>_>
             .super__Head_base<0UL,_llbuild::core::BuildDB_*,_false>._M_head_impl;
    if (pBVar7 != (BuildDB *)0x0) {
      local_90._M_string_length = 0;
      local_90.field_2._M_allocated_capacity =
           local_90.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      (*pBVar7->_vptr_BuildDB[5])
                (pBVar7,*(undefined8 *)
                         ((long)&(p_Var17->
                                 super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
                                 ._M_storage._M_storage + 8),
                 *(long *)((long)&(p_Var17->
                                  super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
                                  ._M_storage._M_storage + 0x10) + 8,
                 (undefined1 *)
                 ((long)&(p_Var17->
                         super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                         ).
                         super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
                         ._M_storage._M_storage + 0x20),&local_90);
      if (local_90._M_string_length != 0) {
        pBVar6 = this->delegate;
        llvm::Twine::Twine((Twine *)local_68,&local_90);
        (*pBVar6->_vptr_BuildEngineDelegate[7])(pBVar6,local_68);
        LOCK();
        (this->buildCancelled)._M_base._M_i = true;
        UNLOCK();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    pBVar6 = this->delegate;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   "attempt to register duplicate rule \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (*(long *)((long)&(p_Var17->
                                     super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                                     ).
                                     super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
                                     ._M_storage._M_storage + 0x10) + 8));
    plVar11 = (long *)std::__cxx11::string::append(&local_68[0].character);
    psVar12 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_90.field_2._M_allocated_capacity = *psVar12;
      local_90.field_2._8_8_ = plVar11[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar12;
      local_90._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_90._M_string_length = plVar11[1];
    *plVar11 = (long)psVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    llvm::Twine::Twine(&local_48,&local_90);
    (*pBVar6->_vptr_BuildEngineDelegate[7])(pBVar6,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68[0].twine != &local_58) {
      operator_delete(local_68[0].twine,local_58._M_allocated_capacity + 1);
    }
    LOCK();
    (this->buildCancelled)._M_base._M_i = true;
    UNLOCK();
  }
  return (RuleInfo *)
         ((long)&(p_Var17->
                 super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                 ).
                 super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
                 ._M_storage._M_storage + 8);
}

Assistant:

RuleInfo& addRule(KeyID keyID, std::unique_ptr<Rule>&& rule) {
    auto result = ruleInfos.emplace(keyID, RuleInfo(keyID, std::move(rule)));
    if (!result.second) {
      RuleInfo& ruleInfo = result.first->second;
      delegate.error("attempt to register duplicate rule \"" + ruleInfo.rule->key.str() + "\"\n");

      // Set cancelled, but return something 'valid' for use until it is
      // processed.
      buildCancelled = true;
      return ruleInfo;
    }

    // If we have a database attached, retrieve any stored result.
    //
    // FIXME: Investigate retrieving this result lazily. If the DB is
    // particularly efficient, it may be best to retrieve this only when we need
    // it and never duplicate it.
    RuleInfo& ruleInfo = result.first->second;
    if (db) {
      std::string error;
      db->lookupRuleResult(ruleInfo.keyID, *ruleInfo.rule, &ruleInfo.result, &error);
      if (!error.empty()) {
        // FIXME: Investigate changing the database error handling model to
        // allow builds to proceed without the database.
        delegate.error(error);
        buildCancelled = true;
      }
    }

    return ruleInfo;
  }